

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsSlicingBounded(void)

{
  reference piVar1;
  ostream *poVar2;
  int iVar3;
  Span<int,_18446744073709551615UL> SVar4;
  initializer_list<int> __l;
  Span<int,_18446744073709551615UL> sub;
  Span<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> values;
  Span<int,_18446744073709551615UL> subsub;
  Span<int,_18446744073709551615UL> local_68;
  Span<int,_18446744073709551615UL> local_58;
  vector<int,_std::allocator<int>_> local_40;
  Span<int,_18446744073709551615UL> local_28;
  
  local_58.m_ptr = (pointer)0x200000001;
  local_58.m_size.m_size = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,(allocator_type *)&local_68);
  local_58.m_ptr = (pointer)0x0;
  if ((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_58.m_ptr =
         local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_58.m_size.m_size =
       (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_68 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&local_58,1,2);
  if (local_68.m_size.m_size.m_size == 2) {
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&local_68,0);
    if (*piVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1fa);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub[0]) == (2)",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      goto LAB_001bfc6e;
    }
    piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&local_68,1);
    if (*piVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1fb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub[1]) == (3)",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      goto LAB_001bfc6e;
    }
    local_28 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&local_68,0,1);
    if (local_28.m_size.m_size.m_size == 1) {
      piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&local_28,0);
      if (*piVar1 != 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1ff);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(subsub[0]) == (2)",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        goto LAB_001bfdd5;
      }
      local_68 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice(&local_58,3,1);
      if (local_68.m_size.m_size.m_size == 1) {
        piVar1 = MILBlob::Util::Span<int,_18446744073709551615UL>::operator[](&local_68,0);
        if (*piVar1 == 4) {
          SVar4 = MILBlob::Util::Span<int,_18446744073709551615UL>::Slice
                            (&local_58,0,local_58.m_size.m_size);
          if (SVar4.m_size.m_size.m_size == local_58.m_size.m_size) {
            if (SVar4.m_ptr == local_58.m_ptr) {
              iVar3 = 0;
              goto LAB_001bfc86;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                       ,0x71);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x20b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2,"(sub.Data()) == (span.Data())",0x1d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," was false, expected true.",0x1a);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                       ,0x71);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x20a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2,"(sub.Size()) == (span.Size())",0x1d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," was false, expected true.",0x1a);
          }
          iVar3 = 1;
          std::endl<char,std::char_traits<char>>(poVar2);
          goto LAB_001bfc86;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x205);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub[0]) == (4)",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a)
        ;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x204);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"(sub.Size()) == (size_t(1))",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a)
        ;
      }
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                 ,0x71);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1fe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"(subsub.Size()) == (size_t(1))",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
LAB_001bfdd5:
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1f9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(sub.Size()) == (size_t(2))",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
LAB_001bfc6e:
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  iVar3 = 1;
LAB_001bfc86:
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int testSpanTestsSlicingBounded()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    {
        auto sub = span.Slice(1, 2);
        ML_ASSERT_EQ(sub.Size(), size_t(2));
        ML_ASSERT_EQ(sub[0], 2);
        ML_ASSERT_EQ(sub[1], 3);

        auto subsub = sub.Slice(0, 1);
        ML_ASSERT_EQ(subsub.Size(), size_t(1));
        ML_ASSERT_EQ(subsub[0], 2);
    }

    {
        auto sub = span.Slice(3, 1);
        ML_ASSERT_EQ(sub.Size(), size_t(1));
        ML_ASSERT_EQ(sub[0], 4);
    }

    {
        auto sub = span.Slice(0, span.Size());
        ML_ASSERT_EQ(sub.Size(), span.Size());
        ML_ASSERT_EQ(sub.Data(), span.Data());
    }

    return 0;
}